

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

void anm_write(anm_archive_t *anm,char *filename,uint version)

{
  short sVar1;
  undefined4 uVar2;
  long *plVar3;
  char *pcVar4;
  uint *puVar5;
  ulong *buffer;
  size_t size;
  ulong uVar6;
  ulong uVar7;
  FILE *__stream;
  uint uVar8;
  FILE *__stream_00;
  long offset;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  int *piVar13;
  char *pcVar14;
  long *plVar15;
  long *plVar16;
  size_t size_00;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long *plVar20;
  int iVar21;
  list_node_t *plVar22;
  short *buffer_00;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anm_instr0_t new_instr;
  undefined4 uStack_6c;
  ulong local_48;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  pcVar4 = argv0;
  if (__stream_00 == (FILE *)0x0) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar4,filename,pcVar14);
    exit(1);
  }
  plVar22 = (list_node_t *)&anm->entries;
  size = 0x14;
  if (version == 0x13) {
    size = 0x28;
  }
  do {
    plVar22 = plVar22->next;
    if (plVar22 == (list_node_t *)0x0) {
      fclose(__stream_00);
      return;
    }
    plVar3 = (long *)plVar22->data;
    offset = file_tell((FILE *)__stream_00);
    fflush(__stream_00);
    sVar9 = strlen((char *)plVar3[2]);
    plVar20 = plVar3 + 7;
    uVar19 = 0xffffffff;
    plVar15 = plVar20;
    iVar21 = 0;
    do {
      iVar17 = iVar21;
      plVar15 = (long *)*plVar15;
      uVar19 = uVar19 + 1;
      iVar21 = iVar17 + 1;
    } while (plVar15 != (long *)0x0);
    plVar15 = plVar3 + 9;
    uVar18 = 0xffffffff;
    plVar16 = plVar15;
    do {
      plVar16 = (long *)*plVar16;
      uVar18 = uVar18 + 1;
    } while (plVar16 != (long *)0x0);
    file_seek((FILE *)__stream_00,(ulong)uVar19 * 4 + offset + (ulong)uVar18 * 8 + 0x40);
    lVar10 = file_tell((FILE *)__stream_00);
    iVar21 = (int)offset;
    *(int *)(*plVar3 + 0x1c) = (int)lVar10 - iVar21;
    pcVar4 = (char *)plVar3[2];
    sVar11 = strlen(pcVar4);
    file_write((FILE *)__stream_00,pcVar4,sVar11);
    file_write((FILE *)__stream_00,"",0x10 - (ulong)((uint)sVar9 & 0xf));
    if (((char *)plVar3[3] != (char *)0x0) && (*(int *)(*plVar3 + 0x28) == 0)) {
      sVar9 = strlen((char *)plVar3[3]);
      lVar10 = file_tell((FILE *)__stream_00);
      *(int *)(*plVar3 + 0x24) = (int)lVar10 - iVar21;
      pcVar4 = (char *)plVar3[3];
      sVar11 = strlen(pcVar4);
      file_write((FILE *)__stream_00,pcVar4,sVar11);
      file_write((FILE *)__stream_00,"",0x10 - (ulong)((uint)sVar9 & 0xf));
    }
    lVar10 = file_tell((FILE *)__stream_00);
    local_48 = lVar10 - offset;
    while (plVar20 = (long *)*plVar20, plVar16 = plVar15, plVar20 != (long *)0x0) {
      file_write((FILE *)__stream_00,(void *)plVar20[2],size);
    }
    while (plVar16 = (long *)*plVar16, plVar16 != (long *)0x0) {
      lVar10 = plVar16[2];
      lVar12 = file_tell((FILE *)__stream_00);
      *(int *)(*(long *)(lVar10 + 8) + 4) = (int)lVar12 - iVar21;
      plVar20 = (long *)(lVar10 + 0x20);
LAB_0010d877:
      while (uVar6 = _new_instr, plVar20 = (long *)*plVar20, plVar20 != (long *)0x0) {
        buffer_00 = (short *)plVar20[2];
        if (*(int *)(*plVar3 + 0x28) == 0) goto LAB_0010d8ac;
        if (*buffer_00 != -1) {
          sVar1 = buffer_00[1];
          buffer_00[1] = sVar1 + 8U;
          size_00 = (size_t)(ushort)(sVar1 + 8U);
          goto LAB_0010d8e3;
        }
        buffer_00[1] = 0;
        file_write((FILE *)__stream_00,buffer_00,8);
      }
      if (*(int *)(lVar10 + 0x50) == 0) {
        if (*(int *)(*plVar3 + 0x28) == 0) {
          _new_instr = _new_instr & 0xffffffff00000000;
          file_write((FILE *)__stream_00,&new_instr,4);
        }
        else {
          _new_instr = 0xffff;
          file_write((FILE *)__stream_00,&new_instr,8);
        }
      }
    }
    if (*(short *)(*plVar3 + 0x34) != 0) {
      lVar10 = file_tell((FILE *)__stream_00);
      *(int *)(*plVar3 + 0x30) = (int)lVar10 - iVar21;
      file_write((FILE *)__stream_00,(void *)plVar3[1],0x10);
      file_write((FILE *)__stream_00,(void *)plVar3[0xb],(ulong)*(uint *)(plVar3[1] + 0xc));
    }
    if (plVar22->next == (list_node_t *)0x0) {
      uVar8 = 0;
    }
    else {
      lVar10 = file_tell((FILE *)__stream_00);
      uVar8 = (int)lVar10 - iVar21;
    }
    puVar5 = (uint *)*plVar3;
    puVar5[0xe] = uVar8;
    *puVar5 = uVar19;
    puVar5[1] = uVar18;
    file_seek((FILE *)__stream_00,offset);
    buffer = (ulong *)*plVar3;
    if ((uint)buffer[5] < 7) {
      file_write((FILE *)__stream_00,buffer,0x40);
    }
    else {
      uVar2 = *(undefined4 *)((long)buffer + 0x3c);
      *(undefined4 *)((long)buffer + 0x3c) = 0;
      uVar6 = *(ulong *)((long)buffer + 0x2c);
      uVar7 = *(ulong *)((long)buffer + 0x34);
      *(undefined8 *)((long)buffer + 0x2c) = 0;
      *(undefined8 *)((long)buffer + 0x34) = 0;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *buffer;
      auVar24 = pshuflw(auVar24,auVar24,0xe8);
      *(int *)((long)buffer + 4) = auVar24._0_4_;
      *(undefined2 *)(buffer + 1) = 0;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)((long)buffer + 0xc);
      auVar24 = pshuflw(auVar25,auVar25,0xe8);
      *(int *)((long)buffer + 10) = auVar24._0_4_;
      *(undefined2 *)((long)buffer + 0xe) = *(undefined2 *)((long)buffer + 0x14);
      *(undefined4 *)(buffer + 2) = *(undefined4 *)((long)buffer + 0x1c);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = buffer[4];
      auVar24 = pshuflw(auVar26,auVar26,0xe8);
      *(int *)((long)buffer + 0x14) = auVar24._0_4_;
      *(uint *)buffer = (uint)buffer[5];
      buffer[3] = uVar6;
      buffer[4] = uVar7;
      *(undefined4 *)(buffer + 5) = uVar2;
      file_write((FILE *)__stream_00,(void *)*plVar3,0x40);
      convert_header_to_old((anm_header06_t *)*plVar3);
    }
    while (bVar23 = iVar17 != 0, iVar17 = iVar17 + -1, bVar23) {
      _new_instr = CONCAT44(uStack_6c,(int)local_48);
      file_write((FILE *)__stream_00,&new_instr,4);
      local_48 = (ulong)(uint)((int)local_48 + (int)size);
    }
    while (plVar15 = (long *)*plVar15, plVar15 != (long *)0x0) {
      file_write((FILE *)__stream_00,*(void **)(plVar15[2] + 8),8);
    }
    file_seek((FILE *)__stream_00,offset + (ulong)*(uint *)(*plVar3 + 0x38));
  } while( true );
LAB_0010d8ac:
  uStack_6c = SUB84(uVar6,4);
  new_instr = (anm_instr0_t)
              CONCAT13((uint8_t)buffer_00[1],(BADTYPE)CONCAT12((uint8_t)*buffer_00,buffer_00[2]));
  file_write((FILE *)__stream_00,&new_instr,4);
  size_00 = _new_instr >> 0x18 & 0xff;
  if (size_00 != 0) {
    buffer_00 = buffer_00 + 4;
LAB_0010d8e3:
    file_write((FILE *)__stream_00,buffer_00,size_00);
  }
  goto LAB_0010d877;
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename,
    unsigned version)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite19_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        fflush(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        /* NEWHU: 19 */
        const unsigned spritesize = version == 19 ? sizeof(sprite19_t) : sizeof(sprite_t);
        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, spritesize);

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->raw_instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (!script->no_sentinel) {
                if (entry->header->version == 0) {
                    anm_instr0_t sentinel = { 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                } else {
                    anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                }
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);

            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * spritesize;
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}